

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remove_unused_columns.cpp
# Opt level: O1

void __thiscall
duckdb::RemoveUnusedColumns::ClearUnusedExpressions<unsigned_long>
          (RemoveUnusedColumns *this,vector<unsigned_long,_true> *list,idx_t table_idx,bool replace)

{
  ColumnBinding current_binding_00;
  iterator iVar1;
  long lVar2;
  idx_t idx;
  ColumnBinding new_binding;
  ColumnBinding current_binding;
  key_type local_40;
  
  if ((list->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (list->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start) {
    lVar2 = 0;
    idx = 0;
    do {
      local_40.column_index = idx + lVar2;
      local_40.table_index = table_idx;
      iVar1 = ::std::
              _Hashtable<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_duckdb::ReferencedColumn>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::ReferencedColumn>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&(this->super_BaseColumnPruner).column_references._M_h,&local_40);
      if (iVar1.
          super__Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_duckdb::ReferencedColumn>,_true>
          ._M_cur == (__node_type *)0x0) {
        vector<unsigned_long,_true>::erase_at(list,idx);
        lVar2 = lVar2 + 1;
        idx = idx - 1;
      }
      else if (lVar2 != 0 && replace) {
        current_binding_00.column_index = local_40.column_index;
        current_binding_00.table_index = local_40.table_index;
        new_binding.column_index = idx;
        new_binding.table_index = table_idx;
        BaseColumnPruner::ReplaceBinding
                  (&this->super_BaseColumnPruner,current_binding_00,new_binding);
      }
      idx = idx + 1;
    } while (idx < (ulong)((long)(list->super_vector<unsigned_long,_std::allocator<unsigned_long>_>)
                                 .super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)(list->super_vector<unsigned_long,_std::allocator<unsigned_long>_>)
                                 .super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 3));
  }
  return;
}

Assistant:

void RemoveUnusedColumns::ClearUnusedExpressions(vector<T> &list, idx_t table_idx, bool replace) {
	idx_t offset = 0;
	for (idx_t col_idx = 0; col_idx < list.size(); col_idx++) {
		auto current_binding = ColumnBinding(table_idx, col_idx + offset);
		auto entry = column_references.find(current_binding);
		if (entry == column_references.end()) {
			// this entry is not referred to, erase it from the set of expressions
			list.erase_at(col_idx);
			offset++;
			col_idx--;
		} else if (offset > 0 && replace) {
			// column is used but the ColumnBinding has changed because of removed columns
			ReplaceBinding(current_binding, ColumnBinding(table_idx, col_idx));
		}
	}
}